

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O1

json * __thiscall
nanojson3::json::json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::read_string
          (json *__return_storage_ptr__,
          json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  pointer pcVar1;
  anon_class_8_1_8991fb9c aVar2;
  int_type iVar3;
  int_type iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bad_format *pbVar10;
  char cVar11;
  uint uVar12;
  string_view reason;
  string_view reason_00;
  string_view reason_01;
  string_view reason_02;
  string_view reason_03;
  string_view reason_04;
  string_view reason_05;
  string_view reason_06;
  string_view reason_07;
  string_view reason_08;
  string_view reason_09;
  anon_class_8_1_8991fb9c hex;
  anon_class_8_1_8991fb9c local_40;
  uint local_34;
  
  iVar3 = input_stream::peek(&this->input_);
  if (iVar3 != 0x22) {
    __assert_fail("*input_ == \'\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x471,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_string() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  iVar3 = input_stream::eat(&this->input_);
  cVar11 = (char)this + '8';
  (this->string_input_buffer_)._M_string_length = 0;
  *(this->string_input_buffer_)._M_dataplus._M_p = '\0';
  do {
    iVar4 = input_stream::peek(&this->input_);
    if (iVar4 == 0x5c) {
      input_stream::eat(&this->input_);
      iVar4 = input_stream::peek(&this->input_);
      if ((((((iVar4 != 0x6e) && (iVar4 = input_stream::peek(&this->input_), iVar4 != 0x74)) &&
            (iVar4 = input_stream::peek(&this->input_), iVar4 != 0x62)) &&
           ((iVar4 = input_stream::peek(&this->input_), iVar4 != 0x66 &&
            (iVar4 = input_stream::peek(&this->input_), iVar4 != 0x72)))) &&
          ((iVar4 = input_stream::peek(&this->input_), iVar4 != 0x5c &&
           ((iVar4 = input_stream::peek(&this->input_), iVar4 != 0x2f &&
            (iVar4 = input_stream::peek(&this->input_), iVar4 != 0x22)))))) &&
         (iVar4 = input_stream::peek(&this->input_), iVar4 != 0x27)) {
        iVar4 = input_stream::peek(&this->input_);
        if (iVar4 != 0x75) {
          pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
          reason_02._M_str = "invalid string format: invalid escape sequence";
          reason_02._M_len = 0x2e;
          bad_format(pbVar10,this,reason_02,(optional<int>)0x0);
          goto LAB_0010b261;
        }
        local_40.this = this;
        input_stream::eat(&this->input_);
        uVar5 = input_stream::peek(&this->input_);
        aVar2.this = local_40.this;
        uVar12 = uVar5 - 0x30;
        if (9 < uVar12) {
          if (uVar5 - 0x41 < 6) {
            uVar12 = uVar5 - 0x37;
          }
          else {
            if (5 < uVar5 - 0x61) {
              pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
              reason_03._M_str = "invalid string format: expected hexadecimal digit for \\u????";
              reason_03._M_len = 0x3c;
              bad_format(pbVar10,aVar2.this,reason_03,(optional<int>)((ulong)uVar5 | 0x100000000));
              goto LAB_0010b261;
            }
            uVar12 = uVar5 - 0x57;
          }
        }
        input_stream::eat(&this->input_);
        uVar6 = input_stream::peek(&this->input_);
        aVar2.this = local_40.this;
        uVar5 = uVar6 - 0x30;
        if (9 < uVar5) {
          if (uVar6 - 0x41 < 6) {
            uVar5 = uVar6 - 0x37;
          }
          else {
            if (5 < uVar6 - 0x61) {
              pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
              reason_04._M_str = "invalid string format: expected hexadecimal digit for \\u????";
              reason_04._M_len = 0x3c;
              bad_format(pbVar10,aVar2.this,reason_04,(optional<int>)((ulong)uVar6 | 0x100000000));
              goto LAB_0010b261;
            }
            uVar5 = uVar6 - 0x57;
          }
        }
        input_stream::eat(&this->input_);
        uVar7 = input_stream::peek(&this->input_);
        aVar2.this = local_40.this;
        uVar6 = uVar7 - 0x30;
        if (9 < uVar6) {
          if (uVar7 - 0x41 < 6) {
            uVar6 = uVar7 - 0x37;
          }
          else {
            if (5 < uVar7 - 0x61) {
              pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
              reason_05._M_str = "invalid string format: expected hexadecimal digit for \\u????";
              reason_05._M_len = 0x3c;
              bad_format(pbVar10,aVar2.this,reason_05,(optional<int>)((ulong)uVar7 | 0x100000000));
              goto LAB_0010b261;
            }
            uVar6 = uVar7 - 0x57;
          }
        }
        local_34 = uVar6;
        input_stream::eat(&this->input_);
        uVar7 = input_stream::peek(&this->input_);
        aVar2.this = local_40.this;
        uVar6 = uVar7 - 0x30;
        if (9 < uVar6) {
          if (uVar7 - 0x41 < 6) {
            uVar6 = uVar7 - 0x37;
          }
          else {
            if (5 < uVar7 - 0x61) {
              pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
              reason_06._M_str = "invalid string format: expected hexadecimal digit for \\u????";
              reason_06._M_len = 0x3c;
              bad_format(pbVar10,aVar2.this,reason_06,(optional<int>)((ulong)uVar7 | 0x100000000));
              goto LAB_0010b261;
            }
            uVar6 = uVar7 - 0x57;
          }
        }
        uVar6 = (uVar5 << 4 | uVar12 << 8 | local_34) << 4 | uVar6;
        if (0x7f < (int)uVar6) {
          if (0x7ff < (int)uVar6) {
            if ((uVar6 & 0xf800) == 0xd800) {
              input_stream::eat(&this->input_);
              iVar4 = input_stream::peek(&this->input_);
              if (iVar4 != 0x5c) {
                pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
                uVar12 = input_stream::peek(&this->input_);
                reason_07._M_str = "invalid string format: expected surrogate pair";
                reason_07._M_len = 0x2e;
                bad_format(pbVar10,this,reason_07,(optional<int>)((ulong)uVar12 | 0x100000000));
                __cxa_throw(pbVar10,&exceptions::bad_format::typeinfo,
                            std::runtime_error::~runtime_error);
              }
              input_stream::eat(&this->input_);
              iVar4 = input_stream::peek(&this->input_);
              if (iVar4 != 0x75) {
                pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
                uVar12 = input_stream::peek(&this->input_);
                reason_08._M_str = "invalid string format: expected surrogate pair";
                reason_08._M_len = 0x2e;
                bad_format(pbVar10,this,reason_08,(optional<int>)((ulong)uVar12 | 0x100000000));
                __cxa_throw(pbVar10,&exceptions::bad_format::typeinfo,
                            std::runtime_error::~runtime_error);
              }
              input_stream::eat(&this->input_);
              iVar4 = input_stream::peek(&this->input_);
              iVar8 = read_string::anon_class_8_1_8991fb9c::operator()(&local_40,iVar4);
              input_stream::eat(&this->input_);
              iVar4 = input_stream::peek(&this->input_);
              iVar9 = read_string::anon_class_8_1_8991fb9c::operator()(&local_40,iVar4);
              input_stream::eat(&this->input_);
              iVar4 = input_stream::peek(&this->input_);
              uVar12 = read_string::anon_class_8_1_8991fb9c::operator()(&local_40,iVar4);
              input_stream::eat(&this->input_);
              iVar4 = input_stream::peek(&this->input_);
              uVar5 = read_string::anon_class_8_1_8991fb9c::operator()(&local_40,iVar4);
              uVar5 = uVar5 | (uVar12 | iVar9 << 4 | iVar8 << 8) << 4;
              uVar12 = uVar5;
              if ((uVar5 & 0xfc00) != 0xd800 || (~uVar6 & 0xdc00) != 0) {
                uVar12 = uVar6;
                uVar6 = uVar5;
              }
              if (((uVar12 & 0xfc00) == 0xd800) && ((uVar6 & 0xfc00) == 0xdc00)) {
                std::__cxx11::string::push_back(cVar11);
                std::__cxx11::string::push_back(cVar11);
                std::__cxx11::string::push_back(cVar11);
                goto LAB_0010ae4b;
              }
              pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
              reason_09._M_str = "invalid string format: invalid surrogate pair sequence";
              reason_09._M_len = 0x36;
              bad_format(pbVar10,this,reason_09,(optional<int>)0x0);
              goto LAB_0010b261;
            }
            std::__cxx11::string::push_back(cVar11);
          }
          std::__cxx11::string::push_back(cVar11);
        }
      }
    }
    else {
      iVar4 = input_stream::peek(&this->input_);
      if (iVar4 == iVar3) {
        input_stream::eat(&this->input_);
        *(undefined1 **)
         &(__return_storage_ptr__->value_).
          super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
          .
          super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
          .
          super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
          .
          super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
          .
          super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
          .
          super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
             = (undefined1 *)
               ((long)&(__return_storage_ptr__->value_).
                       super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                       .
                       super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                       .
                       super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                       .
                       super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                       .
                       super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                       .
                       super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
               + 0x10);
        pcVar1 = (this->string_input_buffer_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,
                   pcVar1 + (this->string_input_buffer_)._M_string_length);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value_).
                 super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                 .
                 super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                 .
                 super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
         + 0x20) = '\x05';
        return __return_storage_ptr__;
      }
      iVar4 = input_stream::peek(&this->input_);
      if (iVar4 == -1) {
        pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
        reason_00._M_str = "invalid string format: unexpected eof";
        reason_00._M_len = 0x25;
        bad_format(pbVar10,this,reason_00,(optional<int>)0x0);
        goto LAB_0010b261;
      }
      iVar4 = input_stream::peek(&this->input_);
      if ((iVar4 < 0x20) || (iVar4 = input_stream::peek(&this->input_), iVar4 == 0x7f)) {
        pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
        uVar12 = input_stream::peek(&this->input_);
        reason._M_str = "invalid string format: control character is not allowed";
        reason._M_len = 0x37;
        bad_format(pbVar10,this,reason,(optional<int>)((ulong)uVar12 | 0x100000000));
        __cxa_throw(pbVar10,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar4 = input_stream::peek(&this->input_);
      if ((iVar4 == 0x2f) && ((this->option_bits_ & allow_unescaped_forward_slash) == none)) {
        pbVar10 = (bad_format *)__cxa_allocate_exception(0x10);
        reason_01._M_str = "invalid string format: unescaped \'/\' is not allowed";
        reason_01._M_len = 0x33;
        bad_format(pbVar10,this,reason_01,(optional<int>)0x0);
LAB_0010b261:
        __cxa_throw(pbVar10,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
      }
      input_stream::peek(&this->input_);
    }
LAB_0010ae4b:
    std::__cxx11::string::push_back(cVar11);
    input_stream::eat(&this->input_);
  } while( true );
}

Assistant:

json read_string()
        {
            // check quote character
            assert(*input_ == '"');
            int_type quote = *input_++; // '"'

            auto& ret = string_input_buffer_;
            ret.clear();

            while (true)
            {
                if (input_.eat('\\')) // escape sequence found?
                {
                    if (*input_ == 'n') ret += '\n';
                    else if (*input_ == 't') ret += '\t';
                    else if (*input_ == 'b') ret += '\b';
                    else if (*input_ == 'f') ret += '\f';
                    else if (*input_ == 'r') ret += '\r';
                    else if (*input_ == '\\') ret += '\\';
                    else if (*input_ == '/') ret += '/';
                    else if (*input_ == '\"') ret += '\"';
                    else if (*input_ == '\'') ret += '\'';
                    else if (*input_ == 'u') // \uXXXX is converted to UTF-8 sequence
                    {
                        auto hex = [&](int_type chr)
                        {
                            if (chr >= '0' && chr <= '9') { return chr - '0'; }
                            if (chr >= 'A' && chr <= 'F') { return chr - 'A' + 10; }
                            if (chr >= 'a' && chr <= 'f') { return chr - 'a' + 10; }
                            throw bad_format("invalid string format: expected hexadecimal digit for \\u????", chr);
                        };

                        int code = 0;
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);

                        if (code < 0x80) // 7 bit
                        {
                            ret += static_cast<char>((code >> 0 & 0x7F) | 0x00);
                        }
                        else if (code < 0x0800) // 11 bit
                        {
                            ret += static_cast<char>((code >> 6 & 0x1f) | 0xC0);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                        else if ((code & 0xF800) == 0xD800) // surrogate pair
                        {
                            // assume next surrogate is following.
                            if (*++input_ != '\\') throw bad_format("invalid string format: expected surrogate pair", *input_);
                            if (*++input_ != 'u') throw bad_format("invalid string format: expected surrogate pair", *input_);

                            int code2 = 0;
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);

                            if ((code & 0xFC00) == 0xDC00 && (code2 & 0xFC00) == 0xD800)
                                std::swap(code, code2);

                            if ((code & 0xFC00) == 0xD800 && (code2 & 0xFC00) == 0xDC00)
                                code = ((code & 0x3FF) << 10 | (code2 & 0x3FF)) + 0x10000; // 21 bit
                            else
                                throw bad_format("invalid string format: invalid surrogate pair sequence");

                            ret += static_cast<char>((code >> 18 & 0x07) | 0xF0);
                            ret += static_cast<char>((code >> 12 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 6 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                        else // 16 bit
                        {
                            ret += static_cast<char>((code >> 12 & 0x0f) | 0xE0);
                            ret += static_cast<char>((code >> 6 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                    }
                    else
                    {
                        throw bad_format("invalid string format: invalid escape sequence");
                    }
                }
                else if (input_.eat(quote)) break; // end of string.
                else if (*input_ == EOF) throw bad_format("invalid string format: unexpected eof");
                else if (*input_ < 0x20 || *input_ == 0x7F) throw bad_format("invalid string format: control character is not allowed", *input_);
                else if (*input_ == '/' && !has_option(json_parse_option::allow_unescaped_forward_slash)) throw bad_format("invalid string format: unescaped '/' is not allowed");
                else ret += static_cast<char_type>(*input_); // OK. normal character.
                ++input_;
            }

            return json{in_place_index::string, ret}; // copy
        }